

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O0

void idwt_per_stride(double *cA,int len_cA,double *cD,double *lpr,double *hpr,int lpr_len,double *X,
                    int istride,int ostride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int ns;
  int ms;
  int is;
  int l2;
  int t;
  int n;
  int m;
  int l;
  int i;
  int len_avg;
  int lpr_len_local;
  double *hpr_local;
  double *lpr_local;
  double *cD_local;
  int len_cA_local;
  double *cA_local;
  
  iVar1 = lpr_len / 2;
  t = -2;
  l2 = -1;
  for (m = 0; m < len_cA + iVar1 + -1; m = m + 1) {
    t = t + 2;
    l2 = l2 + 2;
    iVar2 = t * ostride;
    iVar3 = l2 * ostride;
    X[iVar2] = 0.0;
    X[iVar3] = 0.0;
    for (n = 0; n < iVar1; n = n + 1) {
      iVar4 = n * 2;
      if ((m - n < 0) || (len_cA <= m - n)) {
        if ((m - n < len_cA) || (len_cA + lpr_len + -1 <= m - n)) {
          if ((m - n < 0) &&
             (iVar5 = m - n, iVar5 != -iVar1 && SBORROW4(iVar5,-iVar1) == iVar5 + iVar1 < 0)) {
            iVar5 = ((len_cA + m) - n) * istride;
            X[iVar2] = lpr[iVar4] * cA[iVar5] + hpr[iVar4] * cD[iVar5] + X[iVar2];
            X[iVar3] = lpr[iVar4 + 1] * cA[iVar5] + hpr[iVar4 + 1] * cD[iVar5] + X[iVar3];
          }
        }
        else {
          iVar5 = ((m - n) - len_cA) * istride;
          X[iVar2] = lpr[iVar4] * cA[iVar5] + hpr[iVar4] * cD[iVar5] + X[iVar2];
          X[iVar3] = lpr[iVar4 + 1] * cA[iVar5] + hpr[iVar4 + 1] * cD[iVar5] + X[iVar3];
        }
      }
      else {
        iVar5 = (m - n) * istride;
        X[iVar2] = lpr[iVar4] * cA[iVar5] + hpr[iVar4] * cD[iVar5] + X[iVar2];
        X[iVar3] = lpr[iVar4 + 1] * cA[iVar5] + hpr[iVar4 + 1] * cD[iVar5] + X[iVar3];
      }
    }
  }
  return;
}

Assistant:

void idwt_per_stride(double *cA, int len_cA, double *cD, double *lpr, double *hpr, int lpr_len, double *X, int istride, int ostride) {
	int len_avg, i, l, m, n, t, l2;
	int is, ms, ns;

	len_avg = lpr_len;
	l2 = len_avg / 2;
	m = -2;
	n = -1;

	for (i = 0; i < len_cA + l2 - 1; ++i) {
		m += 2;
		n += 2;
		ms = m * ostride;
		ns = n * ostride;
		X[ms] = 0.0;
		X[ns] = 0.0;
		for (l = 0; l < l2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				is = (i - l) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
			else if ((i - l) >= len_cA && (i - l) < len_cA + len_avg - 1) {
				is = (i - l - len_cA) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
			else if ((i - l) < 0 && (i - l) > -l2) {
				is = (len_cA + i - l) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
		}
	}
}